

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_impl.c
# Opt level: O2

void gf_25519_sqr(gf_25519_s *cs,gf_25519_s *as)

{
  word_t *b;
  word_t *b_00;
  word_t wVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  uint64_t uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  __uint128_t accum0;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar12 = as->limb[0];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar12;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar12;
  local_48 = auVar2 * auVar6;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar12 * 2;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = as->limb[1];
  local_58 = auVar3 * auVar7;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar12 * 2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = as->limb[2];
  local_68 = auVar4 * auVar8;
  uVar11 = as->limb[1];
  mac_rr((__uint128_t *)local_68,uVar11,uVar11);
  b = as->limb + 4;
  mac_rm((__uint128_t *)local_48,uVar11 * 0x26,b);
  uVar11 = as->limb[2] * 0x26;
  b_00 = as->limb + 3;
  mac_rm((__uint128_t *)local_48,uVar11,b_00);
  mac_rm((__uint128_t *)local_58,uVar11,b);
  wVar1 = as->limb[3];
  mac_rm((__uint128_t *)local_58,wVar1 * 0x13,b_00);
  mac_rm((__uint128_t *)local_68,wVar1 * 0x26,b);
  uVar12 = local_48._8_8_ << 0xd | (ulong)local_48._0_8_ >> 0x33;
  uVar14 = local_48._0_8_ & 0x7ffffffffffff;
  uVar13 = uVar12 + local_58._0_8_;
  uVar12 = (local_58._8_8_ + (ulong)CARRY8(uVar12,local_58._0_8_)) * 0x2000 | uVar13 >> 0x33;
  uVar10 = uVar12 + local_68._0_8_;
  local_48._8_8_ = local_68._8_8_ + (ulong)CARRY8(uVar12,local_68._0_8_);
  local_48._0_8_ = local_48._8_8_ * 0x2000 | uVar10 >> 0x33;
  cs->limb[2] = uVar10 & 0x7ffffffffffff;
  local_48._8_8_ = (ulong)local_48._8_8_ >> 0x33;
  uVar11 = as->limb[0] * 2;
  mac_rm((__uint128_t *)local_48,uVar11,b_00);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar11;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = as->limb[4];
  local_58 = auVar5 * auVar9;
  uVar11 = as->limb[1] * 2;
  mac_rm((__uint128_t *)local_48,uVar11,as->limb + 2);
  mac_rm((__uint128_t *)local_58,uVar11,b_00);
  mac_rr((__uint128_t *)local_48,as->limb[4] * 0x13,as->limb[4]);
  mac_rr((__uint128_t *)local_58,as->limb[2],as->limb[2]);
  uVar12 = local_48._8_8_ << 0xd | (ulong)local_48._0_8_ >> 0x33;
  uVar10 = uVar12 + local_58._0_8_;
  cs->limb[3] = local_48._0_8_ & 0x7ffffffffffff;
  cs->limb[4] = uVar10 & 0x7ffffffffffff;
  uVar14 = ((local_58._8_8_ + (ulong)CARRY8(uVar12,local_58._0_8_)) * 0x2000 | uVar10 >> 0x33) *
           0x13 + uVar14;
  cs->limb[0] = uVar14 & 0x7ffffffffffff;
  cs->limb[1] = (uVar13 & 0x7ffffffffffff) + (uVar14 >> 0x33);
  return;
}

Assistant:

void gf_sqr (gf_s *__restrict__ cs, const gf as) {
    const uint64_t *a = as->limb, mask = ((1ull<<51)-1);
    uint64_t *c = cs->limb;
    
    __uint128_t accum0, accum1, accum2;
    
    uint64_t ai = a[0];
    accum0 = widemul_rr(ai, ai);
    ai *= 2;
    accum1 = widemul_rm(ai, &a[1]);
    accum2 = widemul_rm(ai, &a[2]);
    
    ai = a[1];
    mac_rr(&accum2, ai, ai);
    ai *= 38;
    mac_rm(&accum0, ai, &a[4]);
    
    ai = a[2] * 38;
    mac_rm(&accum0, ai, &a[3]);
    mac_rm(&accum1, ai, &a[4]);
    
    ai = a[3] * 19;
    mac_rm(&accum1, ai, &a[3]);
    ai *= 2;
    mac_rm(&accum2, ai, &a[4]);
    
    uint64_t c0 = accum0 & mask;
    accum1 += shrld(accum0, 51);
    uint64_t c1 = accum1 & mask;
    accum2 += shrld(accum1, 51);
    c[2] = accum2 & mask;
    
    accum0 = accum2 >> 51;
    
    ai = a[0]*2;
    mac_rm(&accum0, ai, &a[3]);
    accum1 = widemul_rm(ai, &a[4]);
    
    ai = a[1]*2;
    mac_rm(&accum0, ai, &a[2]);
    mac_rm(&accum1, ai, &a[3]);
    
    mac_rr(&accum0, a[4]*19, a[4]);
    mac_rr(&accum1, a[2], a[2]);
    
    c[3] = accum0 & mask;
    accum1 += shrld(accum0, 51);
    c[4] = accum1 & mask;
    
    /* 2^102 * 16 * 5 * 19 * (1+ep) >> 64
     * = 2^(-13 + <13)
     */
    
    uint64_t a1 = shrld(accum1,51);
    accum1 = a1 * 19 + c0;
    c[0] = accum1 & mask;
    c[1] = c1 + (accum1>>51);
}